

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  int iVar1;
  uchar *puVar2;
  double r;
  int eType;
  uchar *z;
  int n;
  int i;
  DateTime *p_local;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  memset(p,0,0x30);
  if (argc == 0) {
    iVar1 = sqlite3NotPureFunc(context);
    if (iVar1 == 0) {
      context_local._4_4_ = 1;
    }
    else {
      context_local._4_4_ = setDateTimeToCurrent(context,p);
    }
  }
  else {
    iVar1 = sqlite3_value_type(*argv);
    if ((iVar1 == 2) || (iVar1 == 1)) {
      r = sqlite3_value_double(*argv);
      setRawDateNumber(p,r);
    }
    else {
      puVar2 = sqlite3_value_text(*argv);
      if ((puVar2 == (uchar *)0x0) ||
         (iVar1 = parseDateOrTime(context,(char *)puVar2,p), iVar1 != 0)) {
        return 1;
      }
    }
    for (z._4_4_ = 1; z._4_4_ < argc; z._4_4_ = z._4_4_ + 1) {
      puVar2 = sqlite3_value_text(argv[z._4_4_]);
      iVar1 = sqlite3_value_bytes(argv[z._4_4_]);
      if ((puVar2 == (uchar *)0x0) ||
         (iVar1 = parseModifier(context,(char *)puVar2,iVar1,p,z._4_4_), iVar1 != 0)) {
        return 1;
      }
    }
    computeJD(p);
    if ((p->isError == '\0') && (iVar1 = validJulianDay(p->iJD), iVar1 != 0)) {
      context_local._4_4_ = 0;
    }
    else {
      context_local._4_4_ = 1;
    }
  }
  return context_local._4_4_;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}